

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImg<unsigned_char> *__return_storage_ptr__,CImgList<unsigned_char> *this,char axis,
          float align)

{
  uint uVar1;
  uint uVar2;
  CImg<unsigned_char> *pCVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int l;
  
  pCVar3 = this->_data;
  uVar8 = this->_width;
  if (uVar8 == 0 || pCVar3 == (CImg<unsigned_char> *)0x0) {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else if (uVar8 == 1) {
    CImg<unsigned_char>::operator+(__return_storage_ptr__,pCVar3);
  }
  else {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
    cVar4 = axis + ' ';
    if ((byte)(axis + 0xa5U) < 0xe6) {
      cVar4 = axis;
    }
    uVar5 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    if (cVar4 == 'x') {
      uVar11 = 0;
      uVar7 = 0;
      uVar12 = 0;
      for (lVar10 = 0; (ulong)uVar8 * 0x20 != lVar10; lVar10 = lVar10 + 0x20) {
        uVar5 = uVar5 + *(int *)((long)&pCVar3->_width + lVar10);
        uVar1 = *(uint *)((long)&pCVar3->_height + lVar10);
        uVar2 = *(uint *)((long)&pCVar3->_depth + lVar10);
        if (uVar11 <= uVar1) {
          uVar11 = uVar1;
        }
        if (uVar7 <= uVar2) {
          uVar7 = uVar2;
        }
        uVar1 = *(uint *)((long)&pCVar3->_spectrum + lVar10);
        if (uVar12 <= uVar1) {
          uVar12 = uVar1;
        }
      }
      CImg<unsigned_char>::assign(__return_storage_ptr__,uVar5,uVar11,uVar7,uVar12,'\0');
      if (__return_storage_ptr__->_data != (uchar *)0x0) {
        lVar10 = 0;
        iVar9 = 0;
        for (lVar6 = 0; lVar6 < (int)this->_width; lVar6 = lVar6 + 1) {
          pCVar3 = this->_data;
          CImg<unsigned_char>::draw_image
                    (__return_storage_ptr__,iVar9,
                     (int)((float)(uVar11 - *(int *)((long)&pCVar3->_height + lVar10)) * align),
                     (int)((float)(uVar7 - *(int *)((long)&pCVar3->_depth + lVar10)) * align),
                     (int)((float)(uVar12 - *(int *)((long)&pCVar3->_spectrum + lVar10)) * align),
                     (CImg<unsigned_char> *)((long)&pCVar3->_width + lVar10),1.0);
          iVar9 = iVar9 + *(int *)((long)&this->_data->_width + lVar10);
          lVar10 = lVar10 + 0x20;
        }
      }
    }
    else {
      lVar10 = (ulong)uVar8 * 0x20;
      if (cVar4 == 'y') {
        uVar8 = 0;
        uVar7 = 0;
        uVar5 = 0;
        uVar11 = 0;
        for (lVar6 = 0; lVar10 != lVar6; lVar6 = lVar6 + 0x20) {
          uVar12 = *(uint *)((long)&pCVar3->_width + lVar6);
          if (uVar8 <= uVar12) {
            uVar8 = uVar12;
          }
          uVar12 = *(uint *)((long)&pCVar3->_depth + lVar6);
          uVar7 = uVar7 + *(int *)((long)&pCVar3->_height + lVar6);
          if (uVar5 <= uVar12) {
            uVar5 = uVar12;
          }
          uVar12 = *(uint *)((long)&pCVar3->_spectrum + lVar6);
          if (uVar11 <= uVar12) {
            uVar11 = uVar12;
          }
        }
        CImg<unsigned_char>::assign(__return_storage_ptr__,uVar8,uVar7,uVar5,uVar11,'\0');
        if (__return_storage_ptr__->_data != (uchar *)0x0) {
          lVar10 = 0;
          iVar9 = 0;
          for (lVar6 = 0; lVar6 < (int)this->_width; lVar6 = lVar6 + 1) {
            pCVar3 = this->_data;
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,
                       (int)((float)(uVar8 - *(int *)((long)&pCVar3->_width + lVar10)) * align),
                       iVar9,(int)((float)(uVar5 - *(int *)((long)&pCVar3->_depth + lVar10)) * align
                                  ),
                       (int)((float)(uVar11 - *(int *)((long)&pCVar3->_spectrum + lVar10)) * align),
                       (CImg<unsigned_char> *)((long)&pCVar3->_width + lVar10),1.0);
            iVar9 = iVar9 + *(int *)((long)&this->_data->_height + lVar10);
            lVar10 = lVar10 + 0x20;
          }
        }
      }
      else if (cVar4 == 'z') {
        uVar8 = 0;
        uVar5 = 0;
        uVar7 = 0;
        uVar11 = 0;
        for (lVar6 = 0; lVar10 != lVar6; lVar6 = lVar6 + 0x20) {
          uVar12 = *(uint *)((long)&pCVar3->_width + lVar6);
          uVar1 = *(uint *)((long)&pCVar3->_height + lVar6);
          if (uVar8 <= uVar12) {
            uVar8 = uVar12;
          }
          if (uVar5 <= uVar1) {
            uVar5 = uVar1;
          }
          uVar7 = uVar7 + *(int *)((long)&pCVar3->_depth + lVar6);
          uVar12 = *(uint *)((long)&pCVar3->_spectrum + lVar6);
          if (uVar11 <= uVar12) {
            uVar11 = uVar12;
          }
        }
        CImg<unsigned_char>::assign(__return_storage_ptr__,uVar8,uVar5,uVar7,uVar11,'\0');
        if (__return_storage_ptr__->_data != (uchar *)0x0) {
          lVar10 = 0;
          iVar9 = 0;
          for (lVar6 = 0; lVar6 < (int)this->_width; lVar6 = lVar6 + 1) {
            pCVar3 = this->_data;
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,
                       (int)((float)(uVar8 - *(int *)((long)&pCVar3->_width + lVar10)) * align),
                       (int)((float)(uVar5 - *(int *)((long)&pCVar3->_height + lVar10)) * align),
                       iVar9,(int)((float)(uVar11 - *(int *)((long)&pCVar3->_spectrum + lVar10)) *
                                  align),(CImg<unsigned_char> *)((long)&pCVar3->_width + lVar10),1.0
                      );
            iVar9 = iVar9 + *(int *)((long)&this->_data->_depth + lVar10);
            lVar10 = lVar10 + 0x20;
          }
        }
      }
      else {
        uVar8 = 0;
        uVar5 = 0;
        uVar11 = 0;
        uVar7 = 0;
        for (lVar6 = 0; lVar10 != lVar6; lVar6 = lVar6 + 0x20) {
          uVar12 = *(uint *)((long)&pCVar3->_width + lVar6);
          uVar1 = *(uint *)((long)&pCVar3->_height + lVar6);
          if (uVar8 <= uVar12) {
            uVar8 = uVar12;
          }
          if (uVar5 <= uVar1) {
            uVar5 = uVar1;
          }
          uVar12 = *(uint *)((long)&pCVar3->_depth + lVar6);
          if (uVar11 <= uVar12) {
            uVar11 = uVar12;
          }
          uVar7 = uVar7 + *(int *)((long)&pCVar3->_spectrum + lVar6);
        }
        CImg<unsigned_char>::assign(__return_storage_ptr__,uVar8,uVar5,uVar11,uVar7,'\0');
        if (__return_storage_ptr__->_data != (uchar *)0x0) {
          lVar10 = 0;
          iVar9 = 0;
          for (lVar6 = 0; lVar6 < (int)this->_width; lVar6 = lVar6 + 1) {
            pCVar3 = this->_data;
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,
                       (int)((float)(uVar8 - *(int *)((long)&pCVar3->_width + lVar10)) * align),
                       (int)((float)(uVar5 - *(int *)((long)&pCVar3->_height + lVar10)) * align),
                       (int)((float)(uVar11 - *(int *)((long)&pCVar3->_depth + lVar10)) * align),
                       iVar9,(CImg<unsigned_char> *)((long)&pCVar3->_width + lVar10),1.0);
            iVar9 = iVar9 + *(int *)((long)&this->_data->_spectrum + lVar10);
            lVar10 = lVar10 + 0x20;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::uncase(axis)) {
      case 'x' : { // Along the X-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx+=img._width; dy = cimg::max(dy,img._height); dz = cimg::max(dz,img._depth); dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image(pos,
                           (int)(align*(dy-(*this)[l]._height)),
                           (int)(align*(dz-(*this)[l]._depth)),
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._width;
          }
      } break;
      case 'y' : { // Along the Y-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy+=img._height; dz = cimg::max(dz,img._depth); dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           pos,
                           (int)(align*(dz-(*this)[l]._depth)),
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._height;
          }
      } break;
      case 'z' : { // Along the Z-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy = cimg::max(dy,img._height); dz+=img._depth; dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           (int)(align*(dy-(*this)[l]._height)),
                           pos,
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._depth;
          }
      } break;
      default : { // Along the C-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy = cimg::max(dy,img._height); dz = cimg::max(dz,img._depth); dc+=img._spectrum;
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           (int)(align*(dy-(*this)[l]._height)),
                           (int)(align*(dz-(*this)[l]._depth)),
                           pos,
                           (*this)[l]);
            pos+=(*this)[l]._spectrum;
          }
      }
      }
      return res;
    }